

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O0

bool okHessianDiagonal(HighsOptions *options,HighsHessian *hessian,ObjSense sense)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  double *pdVar4;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  double dVar5;
  bool certainly_not_positive_semidefinite;
  HighsInt iEl;
  double diagonal_value;
  HighsInt iCol;
  HighsInt num_illegal_diagonal_value;
  HighsInt sense_sign;
  HighsInt dim;
  double max_diagonal_value;
  double min_diagonal_value;
  double local_40;
  int local_38;
  uint local_34;
  int local_30;
  int local_2c;
  double local_28;
  HighsLogOptions *local_20;
  int local_14;
  int *local_10;
  long local_8;
  
  local_20 = (HighsLogOptions *)0x7ff0000000000000;
  local_28 = -INFINITY;
  local_2c = *in_RSI;
  local_34 = 0;
  local_30 = in_EDX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_38 = 0; local_38 < local_2c; local_38 = local_38 + 1) {
    local_40 = 0.0;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_10 + 2),(long)local_38);
    dVar5 = (double)local_30;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),(long)*pvVar2);
    local_40 = dVar5 * *pvVar3;
    pdVar4 = std::min<double>(&local_40,(double *)&local_20);
    local_20 = (HighsLogOptions *)*pdVar4;
    pdVar4 = std::max<double>(&local_40,&local_28);
    local_28 = *pdVar4;
    if (local_40 < 0.0) {
      local_34 = local_34 + 1;
    }
  }
  bVar1 = 0 < (int)local_34;
  if (bVar1) {
    if (local_14 == 1) {
      highsLogUser(local_20,(HighsLogType)(local_8 + 0x380),(char *)0x5,
                   "Hessian has %d diagonal entries in [%g, 0) so is not positive semidefinite for minimization\n"
                   ,(ulong)local_34);
    }
    else {
      highsLogUser((HighsLogOptions *)((ulong)local_20 ^ 0x8000000000000000),
                   (HighsLogType)(local_8 + 0x380),(char *)0x5,
                   "Hessian has %d diagonal entries in (0, %g] so is not negative semidefinite for maximization\n"
                   ,(ulong)local_34);
    }
  }
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool okHessianDiagonal(const HighsOptions& options, HighsHessian& hessian,
                       const ObjSense sense) {
  double min_diagonal_value = kHighsInf;
  double max_diagonal_value = -kHighsInf;
  const HighsInt dim = hessian.dim_;
  const HighsInt sense_sign = (HighsInt)sense;
  HighsInt num_illegal_diagonal_value = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    double diagonal_value = 0;
    // Assumes that the diagonal entry is always first, possibly with explicit
    // zero value
    HighsInt iEl = hessian.start_[iCol];
    assert(hessian.index_[iEl] == iCol);
    diagonal_value = sense_sign * hessian.value_[iEl];
    min_diagonal_value = std::min(diagonal_value, min_diagonal_value);
    max_diagonal_value = std::max(diagonal_value, max_diagonal_value);
    // Diagonal entries signed by sense must be non-negative
    if (diagonal_value < 0) num_illegal_diagonal_value++;
  }

  const bool certainly_not_positive_semidefinite =
      num_illegal_diagonal_value > 0;
  if (certainly_not_positive_semidefinite) {
    if (sense == ObjSense::kMinimize) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Hessian has %" HIGHSINT_FORMAT
                   " diagonal entries in [%g, 0) so is not positive "
                   "semidefinite for minimization\n",
                   num_illegal_diagonal_value, min_diagonal_value);
    } else {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Hessian has %" HIGHSINT_FORMAT
                   " diagonal entries in (0, %g] so is not negative "
                   "semidefinite for maximization\n",
                   num_illegal_diagonal_value, -min_diagonal_value);
    }
  }
  return !certainly_not_positive_semidefinite;
}